

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<nanoNet::DataPoint> __l_07;
  initializer_list<float> __l_08;
  initializer_list<float> __l_09;
  initializer_list<float> __l_10;
  initializer_list<float> __l_11;
  allocator_type local_181;
  allocator_type local_180;
  allocator_type local_17f;
  allocator_type local_17e;
  allocator_type local_17d;
  allocator_type local_17c;
  allocator_type local_17b;
  allocator_type local_17a;
  allocator_type local_179;
  _Vector_base<float,_std::allocator<float>_> local_178;
  undefined8 local_160;
  float local_158 [2];
  NeuralNetwork network;
  Trainer trainer;
  DataSet data;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  NeuralNetworkLayer local_f8;
  vector<float,_std::allocator<float>_> local_b0;
  vector<float,_std::allocator<float>_> local_98;
  vector<float,_std::allocator<float>_> local_80;
  vector<float,_std::allocator<float>_> local_68;
  vector<float,_std::allocator<float>_> local_50;
  vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_> local_38;
  float local_20 [2];
  
  nanoNet::NeuralNetwork::NeuralNetwork(&network);
  data.super__Vector_base<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  nanoNet::ActivationFunction::ActivationFunction((ActivationFunction *)&trainer,(Which *)&data);
  nanoNet::NeuralNetworkLayer::NeuralNetworkLayer(&local_f8,2,8,(ActivationFunction *)&trainer);
  nanoNet::NeuralNetwork::addLayer(&network,&local_f8);
  nanoNet::NeuralNetworkLayer::~NeuralNetworkLayer(&local_f8);
  data.super__Vector_base<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  nanoNet::ActivationFunction::ActivationFunction((ActivationFunction *)&trainer,(Which *)&data);
  nanoNet::NeuralNetworkLayer::NeuralNetworkLayer(&local_f8,8,1,(ActivationFunction *)&trainer);
  nanoNet::NeuralNetwork::addLayer(&network,&local_f8);
  nanoNet::NeuralNetworkLayer::~NeuralNetworkLayer(&local_f8);
  trainer.epoch_count = 10000;
  trainer.batch_size = 2;
  trainer.learning_rate = 0.002;
  local_178._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_178;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_f8,__l,&local_179);
  local_fc = 0.0;
  __l_00._M_len = 1;
  __l_00._M_array = &local_fc;
  std::vector<float,_std::allocator<float>_>::vector(&local_f8.m_biases,__l_00,&local_17a);
  local_158[0] = 0.0;
  local_158[1] = 1.0;
  __l_01._M_len = 2;
  __l_01._M_array = local_158;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_f8.m_weights,__l_01,&local_17b);
  local_100 = 1.0;
  __l_02._M_len = 1;
  __l_02._M_array = &local_100;
  std::vector<float,_std::allocator<float>_>::vector(&local_b0,__l_02,&local_17c);
  local_160 = 0x3f800000;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_160;
  std::vector<float,_std::allocator<float>_>::vector(&local_98,__l_03,&local_17d);
  local_104 = 1.0;
  __l_04._M_len = 1;
  __l_04._M_array = &local_104;
  std::vector<float,_std::allocator<float>_>::vector(&local_80,__l_04,&local_17e);
  local_20[0] = 1.0;
  local_20[1] = 1.0;
  __l_05._M_len = 2;
  __l_05._M_array = local_20;
  std::vector<float,_std::allocator<float>_>::vector(&local_68,__l_05,&local_17f);
  local_108 = 0.0;
  __l_06._M_len = 1;
  __l_06._M_array = &local_108;
  std::vector<float,_std::allocator<float>_>::vector(&local_50,__l_06,&local_180);
  __l_07._M_len = 4;
  __l_07._M_array = (iterator)&local_f8;
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::vector
            (&data,__l_07,&local_181);
  lVar2 = 0x90;
  do {
    nanoNet::DataPoint::~DataPoint((DataPoint *)((long)&local_f8.m_inputCount + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x30);
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::vector(&local_38,&data);
  nanoNet::Trainer::train(&trainer,&network,&local_38);
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::~vector(&local_38);
  std::operator<<((ostream *)&std::cout,'\n');
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  __l_08._M_len = 2;
  __l_08._M_array = local_158;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_178,__l_08,(allocator_type *)&local_160
            );
  nanoNet::NeuralNetwork::predict((vector_type *)&local_f8,&network,(vector_type *)&local_178);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      (float)(int)(*(float *)local_f8.m_inputCount + *(float *)local_f8.m_inputCount
                                  + 0.5) * 0.5);
  std::operator<<(poVar1,'\n');
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_178);
  local_158[0] = 0.0;
  local_158[1] = 1.0;
  __l_09._M_len = 2;
  __l_09._M_array = local_158;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_178,__l_09,(allocator_type *)&local_160
            );
  nanoNet::NeuralNetwork::predict((vector_type *)&local_f8,&network,(vector_type *)&local_178);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      (float)(int)(*(float *)local_f8.m_inputCount + *(float *)local_f8.m_inputCount
                                  + 0.5) * 0.5);
  std::operator<<(poVar1,'\n');
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_178);
  local_158[0] = 1.0;
  local_158[1] = 0.0;
  __l_10._M_len = 2;
  __l_10._M_array = local_158;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_178,__l_10,(allocator_type *)&local_160
            );
  nanoNet::NeuralNetwork::predict((vector_type *)&local_f8,&network,(vector_type *)&local_178);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      (float)(int)(*(float *)local_f8.m_inputCount + *(float *)local_f8.m_inputCount
                                  + 0.5) * 0.5);
  std::operator<<(poVar1,'\n');
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_178);
  local_158[0] = 1.0;
  local_158[1] = 1.0;
  __l_11._M_len = 2;
  __l_11._M_array = local_158;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_178,__l_11,(allocator_type *)&local_160
            );
  nanoNet::NeuralNetwork::predict((vector_type *)&local_f8,&network,(vector_type *)&local_178);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      (float)(int)(*(float *)local_f8.m_inputCount + *(float *)local_f8.m_inputCount
                                  + 0.5) * 0.5);
  std::operator<<(poVar1,'\n');
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_f8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_178);
  std::operator<<((ostream *)&std::cout,'\n');
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::~vector(&data);
  std::vector<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>::~vector
            (&network.m_layers);
  return 0;
}

Assistant:

int main() {

    NeuralNetwork network;

    network.addLayer({2, 8, {ActivationFunction::Which::Relu}});
    network.addLayer({8, 1, {ActivationFunction::Which::Linear}});

    // 10000 epochs, batch size = 2, training rate = 0.002
    Trainer trainer { 10000 , 2 , 0.002 };

    Trainer::DataSet data {{
        {{{0.0, 0.0}},{{0.0}}},
        {{{0.0, 1.0}},{{1.0}}},
        {{{1.0, 0.0}},{{1.0}}},
        {{{1.0, 1.0}},{{0.0}}}
    }};

    // stochastic gradient descent
    trainer.train ( network, data );

    auto rnd_base = []( float k ){ return [=]( float x ){ return ( int(x*k+0.5) ) / k; }; };
    auto rnd = rnd_base(2);

    std::cout << '\n';
    std::cout << rnd(network.predict({{0.0, 0.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{0.0, 1.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{1.0, 0.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{1.0, 1.0}})[0]) << '\n';
    std::cout << '\n';

    return 0;
}